

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

compute_mul_parity_result
fmt::v9::detail::dragonbox::cache_accessor<double>::compute_mul_parity
          (carrier_uint two_f,cache_entry_type *cache,int beta)

{
  uint64_t uVar1;
  long lVar2;
  int in_EDX;
  uint64_t unaff_retaddr;
  uint128_fallback in_stack_00000008;
  uint128_fallback r;
  undefined8 in_stack_ffffffffffffffb8;
  int line;
  char *in_stack_ffffffffffffffc0;
  uint128_fallback local_30;
  int local_1c;
  compute_mul_parity_result local_2;
  
  line = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (in_EDX < 1) {
    assert_fail(in_stack_ffffffffffffffc0,line,(char *)0x1c8b53);
  }
  if (in_EDX < 0x40) {
    local_1c = in_EDX;
    local_30 = umul192_lower128(unaff_retaddr,in_stack_00000008);
    uVar1 = uint128_fallback::high(&local_30);
    local_2.parity = (uVar1 >> (0x40 - (byte)local_1c & 0x3f) & 1) != 0;
    uVar1 = uint128_fallback::high(&local_30);
    lVar2 = uVar1 << ((byte)local_1c & 0x3f);
    uVar1 = uint128_fallback::low(&local_30);
    local_2.is_integer = lVar2 == 0 && uVar1 >> (0x40 - (byte)local_1c & 0x3f) == 0;
    return local_2;
  }
  assert_fail(in_stack_ffffffffffffffc0,line,(char *)0x1c8b74);
}

Assistant:

static compute_mul_parity_result compute_mul_parity(
      carrier_uint two_f, const cache_entry_type& cache, int beta) noexcept {
    FMT_ASSERT(beta >= 1, "");
    FMT_ASSERT(beta < 64, "");

    auto r = umul192_lower128(two_f, cache);
    return {((r.high() >> (64 - beta)) & 1) != 0,
            ((r.high() << beta) | (r.low() >> (64 - beta))) == 0};
  }